

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O1

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_from_sin
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined4 in_EAX;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar18;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  batch bVar23;
  batch bVar24;
  ulong uVar12;
  
  uVar12 = sin_angle.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  fVar11 = sin_angle.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar14 = sin_angle.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar15 = sin_angle.super_simd_register<float,_xsimd::sse2>.data[1];
  fVar3 = ctx->sin_start_angle;
  fVar17 = sin_angle.super_simd_register<float,_xsimd::sse2>.data[1];
  uVar5 = -(uint)(fVar3 < fVar11);
  uVar7 = -(uint)(fVar3 < fVar17);
  auVar22._4_4_ = uVar7;
  auVar22._0_4_ = uVar5;
  auVar22._8_4_ = -(uint)(fVar3 < fVar14);
  auVar22._12_4_ = -(uint)(fVar3 < fVar15);
  iVar4 = movmskps(in_EAX,auVar22);
  if (iVar4 == 0) {
    bVar24.super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)uVar12;
    bVar24.super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)(uVar12 >> 0x20);
    bVar24.super_simd_register<float,_xsimd::sse2>.data[0] = 1.0;
    bVar24.super_simd_register<float,_xsimd::sse2>.data[1] = 1.0;
    return (batch)bVar24.super_simd_register<float,_xsimd::sse2>.data;
  }
  fVar3 = ctx->sin_end_angle;
  auVar13._4_4_ = -(uint)(fVar17 < fVar3);
  auVar13._0_4_ = -(uint)(fVar11 < fVar3);
  auVar13._8_4_ = -(uint)(fVar14 < fVar3);
  auVar13._12_4_ = -(uint)(fVar15 < fVar3);
  iVar4 = movmskps(iVar4,auVar13);
  if (iVar4 != 0) {
    fVar19 = ABS(fVar11);
    fVar20 = ABS(fVar17);
    auVar21._0_4_ = (1.0 - fVar19) * 0.5;
    auVar21._4_4_ = (1.0 - fVar20) * 0.5;
    auVar21._8_4_ = (1.0 - ABS(fVar14)) * 0.5;
    auVar21._12_4_ = (1.0 - ABS(fVar15)) * 0.5;
    uVar6 = -(uint)(fVar19 <= 0.5);
    uVar8 = -(uint)(fVar20 <= 0.5);
    uVar9 = -(uint)(ABS(fVar14) <= 0.5);
    uVar10 = -(uint)(ABS(fVar15) <= 0.5);
    auVar16._0_4_ = (uint)(fVar11 * fVar11) & uVar6;
    auVar16._4_4_ = (uint)(fVar17 * fVar17) & uVar8;
    auVar16._8_4_ = (uint)(fVar14 * fVar14) & uVar9;
    auVar16._12_4_ = (uint)(fVar15 * fVar15) & uVar10;
    auVar1._4_4_ = ~uVar8 & (uint)auVar21._4_4_;
    auVar1._0_4_ = ~uVar6 & (uint)auVar21._0_4_;
    auVar1._8_4_ = ~uVar9 & (uint)auVar21._8_4_;
    auVar1._12_4_ = ~uVar10 & (uint)auVar21._12_4_;
    auVar16 = auVar16 | auVar1;
    auVar22 = sqrtps(auVar21,auVar16);
    fVar14 = auVar16._0_4_;
    fVar18 = auVar16._4_4_;
    fVar15 = (float)((uint)fVar19 & uVar6 | ~uVar6 & auVar22._0_4_);
    fVar19 = (float)((uint)fVar20 & uVar8 | ~uVar8 & auVar22._4_4_);
    fVar15 = fVar14 * fVar15 *
             ((((fVar14 * 0.0421632 + 0.024181312) * fVar14 + 0.045470025) * fVar14 + 0.074953005) *
              fVar14 + 0.16666752) + fVar15;
    fVar19 = fVar18 * fVar19 *
             ((((fVar18 * 0.0421632 + 0.024181312) * fVar18 + 0.045470025) * fVar18 + 0.074953005) *
              fVar18 + 0.16666752) + fVar19;
    bVar23.super_simd_register<float,_xsimd::sse2>.data[2] =
         ctx->c + (float)((~uVar6 & (uint)(1.5707964 - (fVar15 + fVar15)) | (uint)fVar15 & uVar6) ^
                         (uint)fVar11 & 0x80000000) * ctx->m;
    bVar23.super_simd_register<float,_xsimd::sse2>.data[3] =
         ctx->c + (float)((~uVar8 & (uint)(1.5707964 - (fVar19 + fVar19)) | (uint)fVar19 & uVar8) ^
                         (uint)fVar17 & 0x80000000) * ctx->m;
    bVar23.super_simd_register<float,_xsimd::sse2>.data._0_8_ =
         CONCAT44(-(uint)(fVar17 < fVar3) & uVar7 &
                  (uint)bVar23.super_simd_register<float,_xsimd::sse2>.data[3],
                  -(uint)(fVar11 < fVar3) & uVar5 &
                  (uint)bVar23.super_simd_register<float,_xsimd::sse2>.data[2]) |
         CONCAT44(~uVar7,~uVar5) & 0x3f8000003f800000;
    return (batch)bVar23.super_simd_register<float,_xsimd::sse2>.data;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  return (simd_register<float,_xsimd::sse2>)(auVar2 << 0x40);
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }